

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS
ref_cavity_form_edge_swap
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT node)

{
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_DBL *pRVar4;
  int last;
  uint uVar5;
  REF_STATUS RVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  REF_CELL pRVar12;
  char *pcVar13;
  REF_INT RVar14;
  REF_INT RVar15;
  long lVar16;
  REF_BOOL all_local;
  REF_INT node2;
  REF_INT node3;
  REF_INT face_nodes [3];
  REF_BOOL already_have_it;
  REF_BOOL has_triangle;
  int local_8c;
  REF_INT local_88;
  REF_INT local_84;
  REF_INT local_80;
  REF_INT local_7c;
  REF_CELL local_78;
  REF_INT local_6c;
  REF_NODE local_68;
  ulong local_60;
  int local_58;
  int local_54 [4];
  int local_44;
  long local_40;
  ulong local_38;
  
  local_68 = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  pRVar1 = local_68->part;
  iVar7 = local_68->ref_mpi->id;
  local_40 = (long)node0;
  if (((iVar7 == pRVar1[local_40]) && (iVar7 == pRVar1[node1])) && (iVar7 == pRVar1[node])) {
    if ((0 < ref_grid->cell[9]->n) || (0 < ref_grid->cell[10]->n)) {
      ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
      return 0;
    }
    pRVar12 = ref_grid->cell[8];
    uVar8 = 0xffffffff;
    if (-1 < node0) {
      uVar8 = 0xffffffff;
      if (node0 < pRVar12->ref_adj->nnode) {
        uVar8 = (ulong)(uint)pRVar12->ref_adj->first[local_40];
      }
    }
    if ((int)uVar8 != -1) {
      RVar15 = pRVar12->ref_adj->item[(int)uVar8].ref;
      do {
        local_38 = uVar8;
        if (0 < pRVar12->node_per) {
          iVar7 = 0;
          local_78 = (REF_CELL)(long)RVar15;
          local_58 = RVar15;
          do {
            last = local_58;
            local_60 = CONCAT44(local_60._4_4_,iVar7);
            if (pRVar12->c2n[pRVar12->size_per * local_58 + iVar7] == node1) {
              uVar5 = ref_list_contains(ref_cavity->tet_list,local_58,local_54 + 3);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x522,"ref_cavity_form_edge_swap",(ulong)uVar5,"have tet?");
                return uVar5;
              }
              if (local_54[3] != 0) {
                pcVar13 = "added tet twice?";
                uVar9 = 0x523;
                goto LAB_001d0763;
              }
              uVar5 = ref_list_push(ref_cavity->tet_list,last);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x524,"ref_cavity_form_edge_swap",(ulong)uVar5,"save tet");
                return uVar5;
              }
              uVar5 = ref_cell_all_local(pRVar12,local_68,last,&local_8c);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x525,"ref_cavity_form_edge_swap",(ulong)uVar5,"local cell");
                return uVar5;
              }
              if (local_8c == 0) goto LAB_001d08e5;
              if (0 < pRVar12->face_per) {
                lVar10 = 0;
                lVar16 = 0;
                do {
                  pRVar1 = pRVar12->c2n;
                  iVar7 = pRVar12->size_per;
                  pRVar2 = pRVar12->f2n;
                  lVar11 = 0;
                  do {
                    local_54[lVar11] =
                         pRVar1[(long)*(int *)((long)pRVar2 + lVar11 * 4 + lVar10) +
                                (long)iVar7 * (long)local_78];
                    lVar11 = lVar11 + 1;
                  } while (lVar11 != 3);
                  if (((local_54[1] != node0 && local_54[0] != node0) && local_54[2] != node0 ||
                       (local_54[1] != node1 && local_54[0] != node1) && local_54[2] != node1) &&
                     (uVar5 = ref_cavity_insert_face(ref_cavity,local_54), uVar5 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x534,"ref_cavity_form_edge_swap",(ulong)uVar5,"tet side");
                    return uVar5;
                  }
                  lVar16 = lVar16 + 1;
                  lVar10 = lVar10 + 0x10;
                } while (lVar16 < pRVar12->face_per);
              }
            }
            iVar7 = (int)local_60 + 1;
          } while (iVar7 < pRVar12->node_per);
        }
        pRVar3 = pRVar12->ref_adj->item;
        iVar7 = pRVar3[(int)local_38].next;
        uVar8 = (ulong)iVar7;
        if (uVar8 == 0xffffffffffffffff) {
          RVar15 = -1;
        }
        else {
          RVar15 = pRVar3[uVar8].ref;
        }
      } while (iVar7 != -1);
    }
    local_78 = ref_grid->cell[3];
    uVar5 = ref_cell_has_side(local_78,node0,node1,&local_44);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x53b,"ref_cavity_form_edge_swap",(ulong)uVar5,"triangle side");
      return uVar5;
    }
    if (local_44 != 0) {
      uVar5 = ref_swap_node23(ref_grid,node0,node1,&local_88,&local_6c);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x53e,"ref_cavity_form_edge_swap",(ulong)uVar5,"nodes 2 and 3");
        return uVar5;
      }
      ref_cavity->surf_node = local_88;
      local_7c = 0xffffffff;
      RVar15 = -1;
      uVar8 = 0xffffffff;
      if (-1 < node0) {
        uVar8 = 0xffffffff;
        if (node0 < local_78->ref_adj->nnode) {
          uVar8 = (ulong)(uint)local_78->ref_adj->first[local_40];
        }
      }
      if ((int)uVar8 != -1) {
        RVar15 = local_78->ref_adj->item[(int)uVar8].ref;
      }
      RVar14 = -1;
      pRVar12 = local_78;
      while ((int)uVar8 != -1) {
        local_60 = uVar8;
        if (0 < pRVar12->node_per) {
          lVar10 = 0;
          do {
            if (pRVar12->c2n[(long)pRVar12->size_per * (long)RVar15 + lVar10] == node1) {
              uVar5 = ref_list_push(ref_cavity->tri_list,RVar15);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x544,"ref_cavity_form_edge_swap",(ulong)uVar5,"save tri");
                return uVar5;
              }
              uVar5 = ref_cell_all_local(local_78,local_68,RVar15,&local_8c);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x546,"ref_cavity_form_edge_swap",(ulong)uVar5,"local cell");
                return uVar5;
              }
              if (local_8c == 0) goto LAB_001d08e5;
              RVar14 = local_78->c2n
                       [(long)local_78->size_per * (long)RVar15 + (long)local_78->node_per];
              pRVar12 = local_78;
            }
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 < pRVar12->node_per);
        }
        pRVar3 = pRVar12->ref_adj->item;
        uVar8 = (ulong)pRVar3[(int)local_60].next;
        if (uVar8 == 0xffffffffffffffff) {
          RVar15 = -1;
        }
        else {
          RVar15 = pRVar3[uVar8].ref;
        }
      }
      iVar7 = ref_cavity->tri_list->n;
      lVar10 = (long)iVar7;
      local_7c = RVar14;
      if (lVar10 != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x54d,"ref_cavity_form_edge_swap","expect two tri",2,lVar10);
      }
      if (iVar7 != 2) {
        return (uint)(lVar10 != 2);
      }
      if (local_7c == -1) {
        pcVar13 = "faceid not set";
        uVar9 = 0x54e;
LAB_001d0763:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar9,"ref_cavity_form_edge_swap",pcVar13);
        return 1;
      }
      local_80 = local_6c;
      local_84 = node0;
      uVar5 = ref_cavity_insert_seg(ref_cavity,&local_84);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x551,"ref_cavity_form_edge_swap",(ulong)uVar5,"tri side");
        return uVar5;
      }
      local_84 = local_6c;
      local_80 = node1;
      uVar5 = ref_cavity_insert_seg(ref_cavity,&local_84);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x554,"ref_cavity_form_edge_swap",(ulong)uVar5,"tri side");
        return uVar5;
      }
      local_80 = local_88;
      local_84 = node1;
      uVar5 = ref_cavity_insert_seg(ref_cavity,&local_84);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x557,"ref_cavity_form_edge_swap",(ulong)uVar5,"tri side");
        return uVar5;
      }
      local_84 = local_88;
      local_80 = node0;
      uVar5 = ref_cavity_insert_seg(ref_cavity,&local_84);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x55a,"ref_cavity_form_edge_swap",(ulong)uVar5,"tri side");
        return uVar5;
      }
    }
    RVar6 = ref_cavity_verify_face_manifold(ref_cavity);
    if (RVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x562,"ref_cavity_form_edge_swap",1,"swap face manifold");
      pRVar4 = local_68->real;
      lVar10 = (long)ref_cavity->node;
      printf(" %f %f %f\n",pRVar4[lVar10 * 0xf],pRVar4[lVar10 * 0xf + 1],pRVar4[lVar10 * 0xf + 2]);
      return 1;
    }
    RVar6 = ref_cavity_verify_seg_manifold(ref_cavity);
    if (RVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x563,"ref_cavity_form_edge_swap",1,"swap seg manifold");
      return 1;
    }
  }
  else {
LAB_001d08e5:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_swap(REF_CAVITY ref_cavity,
                                             REF_GRID ref_grid, REF_INT node0,
                                             REF_INT node1, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_node, cell;
  REF_INT node2, node3, face_node, cell_face;
  REF_BOOL has_triangle, has_node0, has_node1;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];
  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");

  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1) ||
      !ref_node_owned(ref_node, node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node0 = (node0 == face_nodes[0] || node0 == face_nodes[1] ||
                   node0 == face_nodes[2]);
      has_node1 = (node1 == face_nodes[0] || node1 == face_nodes[1] ||
                   node1 == face_nodes[2]);
      if (!(has_node0 && has_node1)) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_has_side(ref_cell, node0, node1, &has_triangle),
      "triangle side");
  if (has_triangle) {
    RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3),
        "nodes 2 and 3");

    ref_cavity_surf_node(ref_cavity) = node2;

    seg_nodes[2] = REF_EMPTY;
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
      RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local),
          "local cell");
      if (!all_local) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
      seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
    REIS(2, ref_list_n(ref_cavity_tri_list(ref_cavity)), "expect two tri");
    RUS(REF_EMPTY, seg_nodes[2], "faceid not set");
    seg_nodes[0] = node0;
    seg_nodes[1] = node3;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node3;
    seg_nodes[1] = node1;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node1;
    seg_nodes[1] = node2;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node2;
    seg_nodes[1] = node0;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
  }

  RSB(ref_cavity_verify_face_manifold(ref_cavity), "swap face manifold", {
    printf(" %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "swap seg manifold");

  return REF_SUCCESS;
}